

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

void Luv32fromLuv48(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  
  puVar4 = (uint *)sp->tbuf;
  if (sp->encode_meth == 0) {
    for (; 0 < n; n = n + -1) {
      *puVar4 = (uint)((short)*(ushort *)((long)op + 4) * 0x19a) >> 0xf & 0xff |
                (uint)((short)*(ushort *)((long)op + 2) * 0x19a) >> 7 & 0xff00 |
                (uint)*(ushort *)op << 0x10;
      puVar4 = puVar4 + 1;
      op = (uint8_t *)((long)op + 6);
    }
  }
  else {
    for (; 0 < n; n = n + -1) {
      uVar1 = *(ushort *)op;
      uVar2 = tiff_itrunc((double)(int)(short)*(ushort *)((long)op + 2) * 0.01251220703125,
                          sp->encode_meth);
      uVar3 = tiff_itrunc((double)(int)(short)*(ushort *)((long)op + 4) * 0.01251220703125,
                          sp->encode_meth);
      *puVar4 = uVar3 & 0xff | (uVar2 & 0xff) << 8 | (uint)uVar1 << 0x10;
      puVar4 = puVar4 + 1;
      op = (uint8_t *)((long)op + 6);
    }
  }
  return;
}

Assistant:

static void Luv32fromLuv48(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    int16_t *luv3 = (int16_t *)op;

    if (sp->encode_meth == SGILOGENCODE_NODITHER)
    {
        while (n-- > 0)
        {
            *luv++ = (uint32_t)luv3[0] << 16 |
                     (luv3[1] * (uint32_t)(UVSCALE + .5) >> 7 & 0xff00) |
                     (luv3[2] * (uint32_t)(UVSCALE + .5) >> 15 & 0xff);
            luv3 += 3;
        }
        return;
    }
    while (n-- > 0)
    {
        *luv++ =
            (uint32_t)luv3[0] << 16 |
            (tiff_itrunc(luv3[1] * (UVSCALE / (1 << 15)), sp->encode_meth)
                 << 8 &
             0xff00) |
            (tiff_itrunc(luv3[2] * (UVSCALE / (1 << 15)), sp->encode_meth) &
             0xff);
        luv3 += 3;
    }
}